

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O3

void ScalePlane_16(uint16_t *src,int src_stride,int src_width,int src_height,uint16_t *dst,
                  int dst_stride,int dst_width,int dst_height,FilterMode filtering)

{
  FilterMode filtering_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  code *UNRECOVERED_JUMPTABLE;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint32_t *dst_ptr;
  ulong uVar7;
  uint16_t *puVar8;
  FilterMode in_stack_ffffffffffffff38;
  int local_b8;
  int local_a4;
  void *local_a0;
  code *local_98;
  ulong local_90;
  long local_88;
  size_t local_80;
  ulong local_78;
  code *local_70;
  int local_68;
  int local_64;
  int dx;
  int x;
  ulong local_58;
  long local_50;
  uint16_t *local_48;
  long local_40;
  long local_38;
  
  uVar3 = (ulong)(uint)dst_height;
  uVar7 = (ulong)(uint)dst_width;
  puVar8 = (uint16_t *)0x1496bb;
  filtering_00 = ScaleFilterReduce(src_width,src_height,dst_width,dst_height,filtering);
  if (src_height < 0) {
    src = src + ~src_height * src_stride;
    src_stride = -src_stride;
    src_height = -src_height;
  }
  if (src_height == dst_height && dst_width == src_width) {
    CopyPlane_16(src,src_stride,dst,dst_stride,dst_width,dst_height);
    return;
  }
  if (filtering_00 != kFilterBox && dst_width == src_width) {
    iVar1 = FixedDiv_X86(src_height,dst_height);
    ScalePlaneVertical_16
              (src_height,dst_width,dst_height,src_stride,dst_stride,src,dst,0,0,iVar1,1,
               filtering_00);
    return;
  }
  iVar1 = -src_width;
  if (0 < src_width) {
    iVar1 = src_width;
  }
  local_58 = uVar3;
  if (dst_height <= src_height && dst_width <= iVar1) {
    if ((dst_width * 4 == src_width * 3) && (dst_height * 4 == src_height * 3)) {
      iVar1 = 0;
      if (filtering_00 != kFilterLinear) {
        iVar1 = src_stride;
      }
      if (filtering_00 == kFilterNone) {
        UNRECOVERED_JUMPTABLE = ScaleRowDown34_16_C;
        local_98 = ScaleRowDown34_16_C;
      }
      else {
        UNRECOVERED_JUMPTABLE = ScaleRowDown34_0_Box_16_C;
        local_98 = ScaleRowDown34_1_Box_16_C;
      }
      if (2 < dst_height) {
        local_70 = (code *)CONCAT44(local_70._4_4_,dst_height + -2);
        uVar3 = (ulong)iVar1;
        local_40 = (long)src_stride;
        lVar4 = (long)dst_stride;
        local_a0 = (void *)(long)-iVar1;
        local_38 = (long)(src_stride * 2) * 2 + local_40 * 4;
        local_80 = local_40 * 2;
        local_40 = local_40 * 6;
        local_88 = lVar4 * 2;
        local_50 = lVar4 * 6;
        iVar2 = 0;
        local_90 = uVar7;
        local_78 = uVar3;
        local_68 = iVar1;
        do {
          (*UNRECOVERED_JUMPTABLE)(src,uVar3,dst,uVar7);
          puVar8 = dst + lVar4;
          local_48 = dst;
          (*local_98)((long)src + local_80,uVar3,puVar8,uVar7);
          (*UNRECOVERED_JUMPTABLE)((long)src + local_40,local_a0,puVar8 + lVar4,uVar7);
          iVar2 = iVar2 + 3;
          src = (uint16_t *)((long)src + local_38);
          dst = puVar8 + lVar4 + lVar4;
        } while (iVar2 < (int)local_70);
        dst = (uint16_t *)((long)local_48 + local_50);
        dst_height = (int)local_58;
        uVar7 = local_90;
        iVar1 = local_68;
      }
      if (dst_height % 3 != 1) {
        if (dst_height % 3 != 2) {
          return;
        }
        (*UNRECOVERED_JUMPTABLE)(src,(long)iVar1,dst,uVar7 & 0xffffffff);
        src = src + src_stride;
        dst = dst + dst_stride;
        UNRECOVERED_JUMPTABLE = local_98;
      }
      (*UNRECOVERED_JUMPTABLE)(src,0,dst,uVar7 & 0xffffffff);
      return;
    }
    if (dst_height * 2 == src_height && dst_width * 2 == src_width) {
      if (filtering_00 == kFilterLinear) {
        UNRECOVERED_JUMPTABLE = ScaleRowDown2Linear_16_C;
      }
      else {
        UNRECOVERED_JUMPTABLE = ScaleRowDown2Box_16_C;
      }
      if (filtering_00 == kFilterNone) {
        UNRECOVERED_JUMPTABLE = ScaleRowDown2_16_C;
      }
      if (dst_height < 1) {
        return;
      }
      iVar1 = src_stride;
      if (filtering_00 < kFilterBilinear) {
        iVar1 = 0;
      }
      iVar2 = 0;
      if (filtering_00 == kFilterNone) {
        iVar2 = src_stride;
      }
      puVar8 = src + iVar2;
      do {
        (*UNRECOVERED_JUMPTABLE)(puVar8,(long)iVar1,dst,uVar7);
        puVar8 = puVar8 + src_stride * 2;
        dst = dst + dst_stride;
        uVar6 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar6;
      } while (uVar6 != 0);
      return;
    }
    if ((dst_width * 8 == src_width * 3) && (dst_height * 8 == src_height * 3)) {
      libyuv::ScalePlaneDown38_16
                (dst_width,dst_height,src_stride,dst_stride,(int)src,(int)dst,
                 (uint16_t *)CONCAT44(extraout_var,filtering_00),puVar8,in_stack_ffffffffffffff38);
      return;
    }
    if (dst_height * 4 == src_height && dst_width * 4 == src_width) {
      if ((filtering_00 == kFilterBox) || (filtering_00 == kFilterNone)) {
        if (filtering_00 == kFilterNone) {
          UNRECOVERED_JUMPTABLE = ScaleRowDown4_16_C;
        }
        else {
          UNRECOVERED_JUMPTABLE = ScaleRowDown4Box_16_C;
        }
        if (dst_height < 1) {
          return;
        }
        iVar1 = src_stride;
        if (filtering_00 < kFilterBilinear) {
          iVar1 = 0;
        }
        iVar2 = src_stride * 2;
        if (filtering_00 != kFilterNone) {
          iVar2 = 0;
        }
        puVar8 = src + iVar2;
        do {
          (*UNRECOVERED_JUMPTABLE)(puVar8,(long)iVar1,dst,uVar7);
          puVar8 = puVar8 + (src_stride << 2);
          dst = dst + dst_stride;
          uVar6 = (int)uVar3 - 1;
          uVar3 = (ulong)uVar6;
        } while (uVar6 != 0);
        return;
      }
      goto LAB_00149a2a;
    }
  }
  if (dst_height * 2 < src_height && filtering_00 == kFilterBox) {
    x = 0;
    local_a4 = 0;
    dx = 0;
    local_b8 = 0;
    local_64 = 0;
    local_98 = (code *)src;
    ScaleSlope(src_width,src_height,dst_width,dst_height,kFilterBox,&x,&local_a4,&dx,&local_64);
    local_a0 = malloc((ulong)(iVar1 * 4 + 0x3f));
    local_70 = libyuv::ScaleAddCols2_16_C;
    if ((short)dx == 0) {
      local_70 = libyuv::ScaleAddCols1_16_C;
    }
    if (0 < dst_height) {
      local_78 = (ulong)(uint)(src_height << 0x10);
      dst_ptr = (uint32_t *)((long)local_a0 + 0x3fU & 0xffffffffffffffc0);
      local_80 = (size_t)(uint)(iVar1 * 4);
      local_88 = (long)dst_stride;
      local_90 = uVar7;
      do {
        iVar2 = local_a4 >> 0x10;
        local_a4 = local_a4 + local_64;
        if ((int)local_78 <= local_a4) {
          local_a4 = (int)local_78;
        }
        puVar8 = (uint16_t *)((long)local_98 + (long)(iVar2 * src_stride) * 2);
        iVar2 = (local_a4 >> 0x10) - iVar2;
        memset(dst_ptr,0,local_80);
        iVar5 = iVar2;
        if (iVar2 < 2) {
          iVar2 = 1;
          iVar5 = iVar2;
        }
        do {
          ScaleAddRow_16_C(puVar8,dst_ptr,iVar1);
          puVar8 = puVar8 + src_stride;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        (*local_70)(local_90 & 0xffffffff,iVar5,x,dx,dst_ptr,dst);
        dst = dst + local_88;
        local_b8 = local_b8 + 1;
      } while (local_b8 != (int)local_58);
    }
    free(local_a0);
    return;
  }
LAB_00149a2a:
  if (filtering_00 == kFilterNone || dst_height <= src_height) {
    if (filtering_00 == kFilterNone) {
      libyuv::ScalePlaneSimple_16
                (src_width,src_height,dst_width,dst_height,src_stride,dst_stride,src,dst);
    }
    else {
      ScalePlaneBilinearDown_16
                (src_width,src_height,dst_width,dst_height,src_stride,dst_stride,src,dst,
                 filtering_00);
    }
  }
  else {
    ScalePlaneBilinearUp_16
              (src_width,src_height,dst_width,dst_height,src_stride,dst_stride,src,dst,filtering_00)
    ;
  }
  return;
}

Assistant:

LIBYUV_API
void ScalePlane_16(const uint16_t* src,
                   int src_stride,
                   int src_width,
                   int src_height,
                   uint16_t* dst,
                   int dst_stride,
                   int dst_width,
                   int dst_height,
                   enum FilterMode filtering) {
  // Simplify filtering when possible.
  filtering = ScaleFilterReduce(src_width, src_height, dst_width, dst_height,
                                filtering);

  // Negative height means invert the image.
  if (src_height < 0) {
    src_height = -src_height;
    src = src + (src_height - 1) * src_stride;
    src_stride = -src_stride;
  }

  // Use specialized scales to improve performance for common resolutions.
  // For example, all the 1/2 scalings will use ScalePlaneDown2()
  if (dst_width == src_width && dst_height == src_height) {
    // Straight copy.
    CopyPlane_16(src, src_stride, dst, dst_stride, dst_width, dst_height);
    return;
  }
  if (dst_width == src_width && filtering != kFilterBox) {
    int dy = FixedDiv(src_height, dst_height);
    // Arbitrary scale vertically, but unscaled horizontally.
    ScalePlaneVertical_16(src_height, dst_width, dst_height, src_stride,
                          dst_stride, src, dst, 0, 0, dy, 1, filtering);
    return;
  }
  if (dst_width <= Abs(src_width) && dst_height <= src_height) {
    // Scale down.
    if (4 * dst_width == 3 * src_width && 4 * dst_height == 3 * src_height) {
      // optimized, 3/4
      ScalePlaneDown34_16(src_width, src_height, dst_width, dst_height,
                          src_stride, dst_stride, src, dst, filtering);
      return;
    }
    if (2 * dst_width == src_width && 2 * dst_height == src_height) {
      // optimized, 1/2
      ScalePlaneDown2_16(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
      return;
    }
    // 3/8 rounded up for odd sized chroma height.
    if (8 * dst_width == 3 * src_width && 8 * dst_height == 3 * src_height) {
      // optimized, 3/8
      ScalePlaneDown38_16(src_width, src_height, dst_width, dst_height,
                          src_stride, dst_stride, src, dst, filtering);
      return;
    }
    if (4 * dst_width == src_width && 4 * dst_height == src_height &&
        (filtering == kFilterBox || filtering == kFilterNone)) {
      // optimized, 1/4
      ScalePlaneDown4_16(src_width, src_height, dst_width, dst_height,
                         src_stride, dst_stride, src, dst, filtering);
      return;
    }
  }
  if (filtering == kFilterBox && dst_height * 2 < src_height) {
    ScalePlaneBox_16(src_width, src_height, dst_width, dst_height, src_stride,
                     dst_stride, src, dst);
    return;
  }
  if (filtering && dst_height > src_height) {
    ScalePlaneBilinearUp_16(src_width, src_height, dst_width, dst_height,
                            src_stride, dst_stride, src, dst, filtering);
    return;
  }
  if (filtering) {
    ScalePlaneBilinearDown_16(src_width, src_height, dst_width, dst_height,
                              src_stride, dst_stride, src, dst, filtering);
    return;
  }
  ScalePlaneSimple_16(src_width, src_height, dst_width, dst_height, src_stride,
                      dst_stride, src, dst);
}